

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O3

ExpressionValue *
expFuncReadAscii(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  int64_t iVar1;
  int64_t iVar2;
  bool bVar3;
  char cVar4;
  uintmax_t uVar5;
  Identifier *pIVar6;
  long lVar7;
  long lVar8;
  int64_t length;
  int64_t start;
  string result;
  size_t bytesToRead;
  StringLiteral *fileName;
  path fullName;
  error_code error;
  ifstream file;
  char buffer [1024];
  int64_t local_6e8;
  int64_t local_6e0;
  undefined1 *local_6d8;
  long local_6d0;
  undefined1 local_6c8;
  undefined7 uStack_6c7;
  StringLiteral local_6b8;
  StringLiteral *local_698;
  string local_690;
  path local_670;
  error_code local_650;
  undefined1 local_640 [32];
  byte abStack_620 [224];
  undefined8 local_540 [33];
  path local_438 [32];
  
  bVar3 = getExpFuncParameter(parameters,0,&local_698,funcName,false);
  if (!bVar3) {
LAB_0012e583:
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
    return __return_storage_ptr__;
  }
  local_6e0 = 0;
  bVar3 = getExpFuncParameter(parameters,1,&local_6e0,funcName,true);
  if (!bVar3) goto LAB_0012e583;
  local_6e8 = 0;
  pIVar6 = funcName;
  bVar3 = getExpFuncParameter(parameters,2,&local_6e8,funcName,true);
  if (!bVar3) goto LAB_0012e583;
  StringLiteral::path(local_438,local_698);
  getFullPathName(&local_670,local_438);
  ghc::filesystem::path::~path(local_438);
  local_650._M_value = 0;
  local_650._M_cat = (error_category *)std::_V2::system_category();
  uVar5 = ghc::filesystem::file_size(&local_670,&local_650);
  iVar2 = local_6e0;
  pIVar6 = (Identifier *)CONCAT71((int7)((ulong)pIVar6 >> 8),local_6e8 == 0);
  if ((long)uVar5 < local_6e0 + local_6e8 || local_6e8 == 0) {
    local_6e8 = uVar5 - local_6e0;
  }
  iVar1 = local_6e8;
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)local_640,&local_670,_S_in|_S_bin);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    Logger::queueError<StringLiteral>
              ((Logger *)0x1,0x18858d,(char *)local_698,(StringLiteral *)pIVar6);
  }
  else {
    std::istream::seekg(local_640,iVar2,0);
    if ((abStack_620[(long)*(_func_int **)(local_640._0_8_ + -0x18)] & 7) == 0) {
      local_6d8 = &local_6c8;
      local_6d0 = 0;
      local_6c8 = 0;
      if (0 < iVar1) {
        lVar8 = 0;
        do {
          local_6b8._value._M_dataplus._M_p = (pointer)(iVar1 - lVar8);
          if (0x3ff < (long)local_6b8._value._M_dataplus._M_p) {
            local_6b8._value._M_dataplus._M_p = (pointer)0x400;
          }
          std::istream::read(local_640,(long)local_438);
          if ((abStack_620[(long)*(_func_int **)(local_640._0_8_ + -0x18)] & 5) != 0) {
            Logger::queueError<unsigned_long,StringLiteral>
                      (Error,"Failed to read %d byte(s) from offset 0x%08X of %s",
                       (unsigned_long *)&local_6b8,local_698);
LAB_0012e7b1:
            (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
            (__return_storage_ptr__->strValue)._value._M_string_length = 0;
            (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
            __return_storage_ptr__->type = Invalid;
            (__return_storage_ptr__->field_1).intValue = 0;
            goto LAB_0012e7cd;
          }
          if (0 < (long)local_640._8_8_) {
            lVar7 = 0;
            do {
              cVar4 = *(char *)((long)&local_438[0]._path._M_dataplus._M_p + lVar7);
              if (cVar4 == '\0') goto LAB_0012e71b;
              if (cVar4 < ' ') {
                Logger::printError<Identifier>((Logger *)0x0,0x1885ee,(char *)funcName,pIVar6);
                goto LAB_0012e7b1;
              }
              std::__cxx11::string::push_back((char)&local_6d8);
              lVar7 = lVar7 + 1;
            } while (lVar7 < (long)local_640._8_8_);
          }
          lVar8 = lVar8 + 0x400;
        } while (lVar8 < iVar1);
      }
LAB_0012e71b:
      local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_690,local_6d8,local_6d8 + local_6d0);
      StringLiteral::StringLiteral(&local_6b8,&local_690);
      __return_storage_ptr__->type = String;
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->strValue,local_6b8._value._M_dataplus._M_p,
                 local_6b8._value._M_dataplus._M_p + local_6b8._value._M_string_length);
      (__return_storage_ptr__->field_1).intValue = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._value._M_dataplus._M_p != &local_6b8._value.field_2) {
        operator_delete(local_6b8._value._M_dataplus._M_p,
                        local_6b8._value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690._M_dataplus._M_p != &local_690.field_2) {
        operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
      }
LAB_0012e7cd:
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,CONCAT71(uStack_6c7,local_6c8) + 1);
      }
      goto LAB_0012e5e4;
    }
    Logger::queueError<long,StringLiteral>(Error,"Invalid offset 0x%08X of %s",&local_6e0,local_698)
    ;
  }
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
LAB_0012e5e4:
  local_640._0_8_ =
       std::ifstream-in-ghc::filesystem::basic_ifstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_540[0] = 0x1bc630;
  std::filebuf::~filebuf((filebuf *)(local_640 + 0x10));
  local_640._0_8_ =
       std::istream-in-ghc::filesystem::basic_ifstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_540[0] = 0x1bc680;
  local_640._8_8_ = 0;
  std::ios_base::~ios_base((ios_base *)local_540);
  ghc::filesystem::path::~path(&local_670);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncReadAscii(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	int64_t start;
	int64_t length;

	GET_PARAM(parameters,0,fileName);
	GET_OPTIONAL_PARAM(parameters,1,start,0);
	GET_OPTIONAL_PARAM(parameters,2,length,0);

	auto fullName = getFullPathName(fileName->path());

	std::error_code error;
	int64_t totalSize = static_cast<int64_t>(fs::file_size(fullName, error));

	if (length == 0 || start+length > totalSize)
		length = totalSize-start;

	fs::ifstream file(fullName, fs::ifstream::in | fs::ifstream::binary);
	if (!file.is_open())
	{
		Logger::queueError(Logger::Error, "Could not open %s", *fileName);
		return ExpressionValue();
	}

	file.seekg(start);
	if (file.eof() || file.fail())
	{
		Logger::queueError(Logger::Error, "Invalid offset 0x%08X of %s", start, *fileName);
		return ExpressionValue();
	}

	char buffer[1024];
	bool stringTerminated = false;
	std::string result;

	for (int64_t progress = 0; !stringTerminated && progress < length; progress += (int64_t) sizeof(buffer))
	{
		auto bytesToRead = (size_t) std::min((int64_t) sizeof(buffer), length - progress);

		file.read(buffer, bytesToRead);
		if (file.fail())
		{
			Logger::queueError(Logger::Error, "Failed to read %d byte(s) from offset 0x%08X of %s", bytesToRead, *fileName);
			return ExpressionValue();
		}

		for (std::streamsize i = 0; i < file.gcount(); i++)
		{
			if (buffer[i] == 0x00)
			{
				stringTerminated = true;
				break;
			}

			if (buffer[i] < 0x20)
			{
				Logger::printError(Logger::Warning, "%s: Non-ASCII character", funcName);
				return ExpressionValue();
			}

			result += buffer[i];
		}
	}

	return ExpressionValue(result);
}